

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseTextureInfo
               (TextureInfo *texinfo,string *err,json *o,
               bool store_original_json_for_extras_and_extensions)

{
  json *o_00;
  json *err_00;
  bool bVar1;
  string *ret;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [39];
  byte local_29;
  json *pjStack_28;
  bool store_original_json_for_extras_and_extensions_local;
  json *o_local;
  string *err_local;
  TextureInfo *texinfo_local;
  
  if (texinfo == (TextureInfo *)0x0) {
    texinfo_local._7_1_ = false;
  }
  else {
    local_29 = store_original_json_for_extras_and_extensions;
    pjStack_28 = o;
    o_local = (json *)err;
    err_local = (string *)texinfo;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"index",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"TextureInfo",&local_89);
    bVar1 = ParseIntegerProperty(&texinfo->index,err,o,(string *)local_50,true,(string *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    err_00 = o_local;
    o_00 = pjStack_28;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ret = err_local + 4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"texCoord",&local_b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"",&local_d9);
      ParseIntegerProperty
                ((int *)ret,(string *)err_00,o_00,(string *)local_b0,false,(string *)local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      ParseExtrasAndExtensions<tinygltf::TextureInfo>
                ((TextureInfo *)err_local,(string *)o_local,pjStack_28,(bool)(local_29 & 1));
      texinfo_local._7_1_ = true;
    }
    else {
      texinfo_local._7_1_ = false;
    }
  }
  return texinfo_local._7_1_;
}

Assistant:

static bool ParseTextureInfo(
    TextureInfo *texinfo, std::string *err, const detail::json &o,
    bool store_original_json_for_extras_and_extensions) {
  if (texinfo == nullptr) {
    return false;
  }

  if (!ParseIntegerProperty(&texinfo->index, err, o, "index",
                            /* required */ true, "TextureInfo")) {
    return false;
  }

  ParseIntegerProperty(&texinfo->texCoord, err, o, "texCoord", false);

  ParseExtrasAndExtensions(texinfo, err, o,
                           store_original_json_for_extras_and_extensions);

  return true;
}